

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::Data::Copy(Data *this,Recycler *alloc,ByteBlock **finalBlock)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteBlock *this_00;
  byte *dst;
  ulong sizeInBytes;
  DataChunk *pDVar4;
  
  if (finalBlock == (ByteBlock **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcfa,"(finalBlock != nullptr)","Must have valid storage");
    if (!bVar2) {
LAB_007ca064:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sizeInBytes = (ulong)this->currentOffset;
  if (sizeInBytes == 0) {
    this_00 = (ByteBlock *)0x0;
  }
  else {
    this_00 = ByteBlock::New(alloc,(byte *)0x0,this->currentOffset);
    pDVar4 = this->head;
    dst = ByteBlock::GetBuffer(this_00);
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (sizeInBytes <= pDVar4->byteSize) break;
      js_memcpy_s(dst,sizeInBytes,pDVar4->buffer,(ulong)pDVar4->byteSize);
      sizeInBytes = sizeInBytes - pDVar4->byteSize;
      dst = dst + pDVar4->byteSize;
      pDVar4 = pDVar4->nextChunk;
      if (pDVar4 == (DataChunk *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0xd15,"(currentChunk)","We are copying more data than we have!"
                                   );
        if (!bVar2) goto LAB_007ca064;
        *puVar3 = 0;
      }
    }
    js_memcpy_s(dst,sizeInBytes,pDVar4->buffer,sizeInBytes);
  }
  *finalBlock = this_00;
  return;
}

Assistant:

void ByteCodeWriter::Data::Copy(Recycler* alloc, ByteBlock ** finalBlock)
    {
        AssertMsg(finalBlock != nullptr, "Must have valid storage");

        uint cbFinalData = GetCurrentOffset();
        if (cbFinalData == 0)
        {
            *finalBlock = nullptr;
        }
        else
        {
            ByteBlock* finalByteCodeBlock = ByteBlock::New(alloc, /*initialContent*/nullptr, cbFinalData);

            DataChunk* currentChunk = head;
            size_t bytesLeftToCopy = cbFinalData;
            byte* currentDest = finalByteCodeBlock->GetBuffer();
            while (true)
            {
                if (bytesLeftToCopy <= currentChunk->GetSize())
                {
                    js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), bytesLeftToCopy);
                    break;
                }

                js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), currentChunk->GetSize());
                bytesLeftToCopy -= currentChunk->GetSize();
                currentDest += currentChunk->GetSize();

                currentChunk = currentChunk->nextChunk;
                AssertMsg(currentChunk, "We are copying more data than we have!");
            }

            *finalBlock = finalByteCodeBlock;
        }
    }